

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

Barcodes *
ZXing::Pdf417::DoDecode
          (Barcodes *__return_storage_ptr__,BinaryBitmap *image,bool multiple,bool tryRotate,
          bool returnErrors)

{
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *__x;
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *this;
  int iVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  _List_node_base *p_Var6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char cVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  BarcodeFormat local_1ac;
  anon_class_48_1_ba1d7400 rotate;
  Result detectorResult;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  PointT<int> local_128;
  PointT<int> local_120;
  PointT<int> local_118;
  PointT<int> local_110;
  DecoderResult decoderResult;
  
  Detector::Detect(&detectorResult,image,multiple,tryRotate);
  __x = &detectorResult.points;
  if (detectorResult.points.
      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)__x) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = detectorResult.bits.
                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    if (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (detectorResult.bits.
              super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (detectorResult.bits.
              super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    this = &rotate.res.points;
    std::__cxx11::
    list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ::list(this,__x);
    rotate.res.rotation = detectorResult.rotation;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (detectorResult.points.
        super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)__x) {
      bVar2 = false;
      p_Var6 = detectorResult.points.
               super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      do {
        bVar4 = *(byte *)&p_Var6[7]._M_next & *(byte *)&p_Var6[1]._M_next;
        uVar3 = 0x7878787;
        if (bVar4 == 1) {
          uVar16 = (int)(double)p_Var6[1]._M_prev - (int)(double)p_Var6[7]._M_prev;
          uVar3 = -uVar16;
          if (0 < (int)uVar16) {
            uVar3 = uVar16;
          }
        }
        bVar5 = *(byte *)&p_Var6[4]._M_next & *(byte *)&p_Var6[10]._M_next;
        uVar16 = 0x71c71c6;
        if (bVar5 == 1) {
          iVar17 = (int)(double)p_Var6[10]._M_prev - (int)(double)p_Var6[4]._M_prev;
          iVar1 = -iVar17;
          if (0 < iVar17) {
            iVar1 = iVar17;
          }
          uVar16 = (uint)(iVar1 * 0x11) / 0x12;
        }
        bVar7 = *(byte *)&p_Var6[8]._M_prev & *(byte *)&p_Var6[2]._M_prev;
        uVar8 = 0x7878787;
        if (bVar7 == 1) {
          uVar18 = (int)(double)p_Var6[3]._M_next - (int)(double)p_Var6[9]._M_next;
          uVar8 = -uVar18;
          if (0 < (int)uVar18) {
            uVar8 = uVar18;
          }
        }
        bVar9 = *(byte *)&p_Var6[5]._M_prev & *(byte *)&p_Var6[0xb]._M_prev;
        uVar18 = 0x71c71c6;
        if (bVar9 == 1) {
          iVar17 = (int)(double)p_Var6[0xc]._M_next - (int)(double)p_Var6[6]._M_next;
          iVar1 = -iVar17;
          if (0 < iVar17) {
            iVar1 = iVar17;
          }
          uVar18 = (uint)(iVar1 * 0x11) / 0x12;
        }
        if (uVar18 < uVar8) {
          uVar8 = uVar18;
        }
        if (uVar16 < uVar3) {
          uVar3 = uVar16;
        }
        if ((int)uVar8 < (int)uVar3) {
          uVar3 = uVar8;
        }
        uVar16 = 0;
        uVar8 = 0;
        if (bVar4 != 0) {
          uVar18 = (int)(double)p_Var6[1]._M_prev - (int)(double)p_Var6[7]._M_prev;
          uVar8 = -uVar18;
          if (0 < (int)uVar18) {
            uVar8 = uVar18;
          }
        }
        if (bVar5 != 0) {
          iVar17 = (int)(double)p_Var6[10]._M_prev - (int)(double)p_Var6[4]._M_prev;
          iVar1 = -iVar17;
          if (0 < iVar17) {
            iVar1 = iVar17;
          }
          uVar16 = (uint)(iVar1 * 0x11) / 0x12;
        }
        uVar18 = 0;
        uVar10 = 0;
        if (bVar7 != 0) {
          uVar19 = (int)(double)p_Var6[3]._M_next - (int)(double)p_Var6[9]._M_next;
          uVar10 = -uVar19;
          if (0 < (int)uVar19) {
            uVar10 = uVar19;
          }
        }
        if (bVar9 != 0) {
          iVar17 = (int)(double)p_Var6[0xc]._M_next - (int)(double)p_Var6[6]._M_next;
          iVar1 = -iVar17;
          if (0 < iVar17) {
            iVar1 = iVar17;
          }
          uVar18 = (uint)(iVar1 * 0x11) / 0x12;
        }
        if (uVar16 < uVar8) {
          uVar16 = uVar8;
        }
        if (uVar18 < uVar10) {
          uVar18 = uVar10;
        }
        if ((int)uVar18 < (int)uVar16) {
          uVar18 = uVar16;
        }
        ScanningDecoder::Decode
                  (&decoderResult,
                   detectorResult.bits.
                   super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Nullable<ZXing::ResultPoint> *)(p_Var6 + 7),
                   (Nullable<ZXing::ResultPoint> *)&p_Var6[8]._M_prev,
                   (Nullable<ZXing::ResultPoint> *)(p_Var6 + 10),
                   (Nullable<ZXing::ResultPoint> *)&p_Var6[0xb]._M_prev,uVar3,uVar18);
        if (decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          cVar14 = '\x01';
          if (returnErrors) goto LAB_00176779;
        }
        else {
          bVar15 = decoderResult._error._type == None;
          if (!bVar15 && returnErrors) {
LAB_00176779:
            bVar15 = decoderResult._error._type != None;
          }
          cVar14 = '\x01';
          if (bVar15) {
            uVar16 = (uint)(double)p_Var6[1]._M_prev;
            uVar3 = (uint)(double)p_Var6[2]._M_next;
            if (rotate.res.rotation == 0x10e) {
              uVar8 = uVar3;
              uVar3 = ~uVar16 + (rotate.res.bits.
                                 super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_width;
            }
            else if (rotate.res.rotation == 0xb4) {
              uVar8 = ~uVar16 + (rotate.res.bits.
                                 super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_width;
              uVar3 = ~uVar3 + (rotate.res.bits.
                                super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_height;
            }
            else {
              uVar8 = uVar16;
              if (rotate.res.rotation == 0x5a) {
                uVar8 = ~uVar3 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_height;
                uVar3 = uVar16;
              }
            }
            uVar18 = (uint)(double)p_Var6[4]._M_prev;
            uVar16 = (uint)(double)p_Var6[5]._M_next;
            if (rotate.res.rotation == 0x10e) {
              uVar10 = uVar16;
              uVar16 = ~uVar18 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
            }
            else if (rotate.res.rotation == 0xb4) {
              uVar10 = ~uVar18 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
              uVar16 = ~uVar16 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_height;
            }
            else {
              uVar10 = uVar18;
              if (rotate.res.rotation == 0x5a) {
                uVar10 = ~uVar16 + (rotate.res.bits.
                                    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_height;
                uVar16 = uVar18;
              }
            }
            uVar19 = (uint)(double)p_Var6[6]._M_next;
            uVar18 = (uint)(double)p_Var6[6]._M_prev;
            if (rotate.res.rotation == 0x10e) {
              uVar11 = uVar18;
              uVar18 = ~uVar19 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
            }
            else if (rotate.res.rotation == 0xb4) {
              uVar11 = ~uVar19 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
              uVar18 = ~uVar18 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_height;
            }
            else {
              uVar11 = uVar19;
              if (rotate.res.rotation == 0x5a) {
                uVar11 = ~uVar18 + (rotate.res.bits.
                                    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_height;
                uVar18 = uVar19;
              }
            }
            uVar12 = (uint)(double)p_Var6[3]._M_next;
            uVar19 = (uint)(double)p_Var6[3]._M_prev;
            if (rotate.res.rotation == 0x10e) {
              uVar13 = uVar19;
              uVar19 = ~uVar12 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
            }
            else if (rotate.res.rotation == 0xb4) {
              uVar13 = ~uVar12 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_width;
              uVar19 = ~uVar19 + (rotate.res.bits.
                                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_height;
            }
            else {
              uVar13 = uVar12;
              if (rotate.res.rotation == 0x5a) {
                uVar13 = ~uVar19 + (rotate.res.bits.
                                    super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_height;
                uVar19 = uVar12;
              }
            }
            local_128.y = uVar3;
            local_128.x = uVar8;
            local_120.y = uVar16;
            local_120.x = uVar10;
            local_118.y = uVar18;
            local_118.x = uVar11;
            local_110.y = uVar19;
            local_110.x = uVar13;
            local_138 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            local_1ac = PDF417;
            std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
            emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                      ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)__return_storage_ptr__
                       ,&decoderResult,(DetectorResult *)local_148,&local_1ac);
            if ((pointer)local_148._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_);
            }
            bVar2 = (bool)(bVar2 | !multiple);
            cVar14 = multiple;
          }
        }
        if (decoderResult._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (decoderResult._extra.
                     super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decoderResult._error._msg._M_dataplus._M_p != &decoderResult._error._msg.field_2) {
          operator_delete(decoderResult._error._msg._M_dataplus._M_p,
                          decoderResult._error._msg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decoderResult._structuredAppend.id._M_dataplus._M_p !=
            &decoderResult._structuredAppend.id.field_2) {
          operator_delete(decoderResult._structuredAppend.id._M_dataplus._M_p,
                          decoderResult._structuredAppend.id.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decoderResult._ecLevel._M_dataplus._M_p != &decoderResult._ecLevel.field_2) {
          operator_delete(decoderResult._ecLevel._M_dataplus._M_p,
                          decoderResult._ecLevel.field_2._M_allocated_capacity + 1);
        }
        if (decoderResult._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(decoderResult._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)decoderResult._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)decoderResult._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(decoderResult._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)decoderResult._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)decoderResult._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (cVar14 == '\0') {
          if (!bVar2) {
            std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                      (__return_storage_ptr__);
          }
          break;
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)__x);
    }
    while (rotate.res.points.
           super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
           ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
      p_Var6 = (rotate.res.points.
                super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(rotate.res.points.
                      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0xd0);
      rotate.res.points.
      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var6;
    }
    if (rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (rotate.res.bits.
                 super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  while (detectorResult.points.
         super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)__x) {
    p_Var6 = (detectorResult.points.
              super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(detectorResult.points.
                    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0xd0);
    detectorResult.points.
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var6;
  }
  if (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (detectorResult.bits.
               super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

static Barcodes DoDecode(const BinaryBitmap& image, bool multiple, bool tryRotate, bool returnErrors)
{
	Detector::Result detectorResult = Detector::Detect(image, multiple, tryRotate);
	if (detectorResult.points.empty())
		return {};

	auto rotate = [res = detectorResult](PointI p) {
		switch(res.rotation) {
		case 90: return PointI(res.bits->height() - p.y - 1, p.x);
		case 180: return PointI(res.bits->width() - p.x - 1, res.bits->height() - p.y - 1);
		case 270: return PointI(p.y, res.bits->width() - p.x - 1);
		}
		return p;
	};

	Barcodes res;
	for (const auto& points : detectorResult.points) {
		DecoderResult decoderResult =
			ScanningDecoder::Decode(*detectorResult.bits, points[4], points[5], points[6], points[7],
									GetMinCodewordWidth(points), GetMaxCodewordWidth(points));
		if (decoderResult.isValid(returnErrors)) {
			auto point = [&](int i) { return rotate(PointI(points[i].value())); };
			res.emplace_back(std::move(decoderResult), DetectorResult{{}, {point(0), point(2), point(3), point(1)}},
							 BarcodeFormat::PDF417);
			if (!multiple)
				return res;
		}
	}
	return res;
}